

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

char * ravi_typename(lua_State *L,int idx)

{
  TValue *o;
  char *pcVar1;
  ushort uVar2;
  
  o = index2addr(L,idx);
  uVar2 = o->tt_ & 0x7f;
  if (uVar2 < 0x25) {
    switch(uVar2) {
    case 0:
      pcVar1 = "nil";
      break;
    case 1:
      pcVar1 = "boolean";
      break;
    case 2:
      pcVar1 = "lightuserdata";
      break;
    case 3:
      pcVar1 = "number";
      break;
    case 4:
    case 0x14:
      pcVar1 = "string";
      break;
    case 5:
    case 0x15:
switchD_0010fd7f_caseD_5:
      pcVar1 = raviT_objtypename(L,o);
      return pcVar1;
    case 6:
      pcVar1 = "closure";
      break;
    case 7:
      pcVar1 = luaT_objtypename(L,o);
      return pcVar1;
    case 8:
      pcVar1 = "thread";
      break;
    default:
      goto switchD_0010fd7f_caseD_9;
    case 0x13:
      pcVar1 = "integer";
      break;
    case 0x16:
      pcVar1 = "lightCfunction";
    }
  }
  else {
    if (uVar2 == 0x25) goto switchD_0010fd7f_caseD_5;
    if (uVar2 == 0x26) {
      return "Cclosure";
    }
    if (uVar2 == 0x46) {
      return "fastCfunction";
    }
switchD_0010fd7f_caseD_9:
    pcVar1 = "unknown";
  }
  return pcVar1;
}

Assistant:

LUA_API const char *ravi_typename(lua_State *L, int idx) {
  StkId o = index2addr(L, idx);
  switch (ttype(o)) {
    case LUA_TNIL: return "nil";
    case LUA_TBOOLEAN: return "boolean";
    case LUA_TNUMFLT: return "number";
    case LUA_TNUMINT: return "integer";
    case LUA_TLNGSTR: return "string";
    case LUA_TSHRSTR: return "string";
    case LUA_TUSERDATA: return luaT_objtypename(L, o);
    case LUA_TLIGHTUSERDATA: return "lightuserdata";
    case LUA_TLCF: return "lightCfunction";
    case LUA_TCCL: return "Cclosure";
    case LUA_TLCL: return "closure";
    case RAVI_TFCF: return "fastCfunction";
    case LUA_TTHREAD: return "thread";
    case RAVI_TIARRAY:
    case RAVI_TFARRAY:
    case LUA_TTABLE: return raviT_objtypename(L, o);
    default: return "unknown";
  }
}